

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O2

int32_t ncat(char *buffer,uint32_t buflen,...)

{
  undefined8 *in_RAX;
  undefined8 in_RCX;
  long lVar1;
  uint uVar2;
  undefined8 in_RDX;
  undefined8 *puVar3;
  ulong uVar4;
  undefined8 *puVar5;
  char *pcVar6;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  void *in_XMM1_Qa;
  undefined8 local_b8 [4];
  undefined8 local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  va_list args;
  
  local_b8[2] = in_RDX;
  local_b8[3] = in_RCX;
  local_98 = in_R8;
  local_90 = in_R9;
  if ((char)in_RAX != '\0') {
    uStack_88 = in_XMM0_Qa;
    args[0].overflow_arg_area = in_XMM1_Qa;
  }
  if (buffer != (char *)0x0) {
    in_RAX = local_b8;
    puVar3 = (undefined8 *)&stack0x00000008;
    uVar2 = 0x10;
    lVar1 = 0;
    while( true ) {
      if (uVar2 < 0x29) {
        uVar4 = (ulong)uVar2;
        uVar2 = uVar2 + 8;
        puVar5 = (undefined8 *)((long)in_RAX + uVar4);
      }
      else {
        puVar5 = puVar3;
        puVar3 = puVar3 + 1;
      }
      pcVar6 = (char *)*puVar5;
      if (pcVar6 == (char *)0x0) break;
      for (; (lVar1 != 0x9c && (*pcVar6 != '\0')); pcVar6 = pcVar6 + 1) {
        buffer[lVar1] = *pcVar6;
        lVar1 = lVar1 + 1;
      }
    }
    buffer[lVar1] = '\0';
  }
  return (int32_t)in_RAX;
}

Assistant:

static int32_t ncat(char *buffer, uint32_t buflen, ...) {
  va_list args;
  char *str;
  char *p = buffer;
  const char* e = buffer + buflen - 1;

  if (buffer == NULL || buflen < 1) {
    return -1;
  }

  va_start(args, buflen);
  while ((str = va_arg(args, char *)) != 0) {
    char c;
    while (p != e && (c = *str++) != 0) {
      *p++ = c;
    }
  }
  *p = 0;
  va_end(args);

  return static_cast<int32_t>(p - buffer);
}